

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

char ** Abc_NtkCollectCioNames(Abc_Ntk_t *pNtk,int fCollectCos)

{
  char **ppcVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  if (fCollectCos == 0) {
    uVar4 = (ulong)pNtk->vCis->nSize;
    ppcVar1 = (char **)malloc(uVar4 << 3);
    for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,(int)lVar5);
      pcVar3 = Abc_ObjName(pAVar2);
      ppcVar1[lVar5] = pcVar3;
      uVar4 = (ulong)(uint)pNtk->vCis->nSize;
    }
  }
  else {
    uVar4 = (ulong)pNtk->vCos->nSize;
    ppcVar1 = (char **)malloc(uVar4 << 3);
    for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,(int)lVar5);
      pcVar3 = Abc_ObjName(pAVar2);
      ppcVar1[lVar5] = pcVar3;
      uVar4 = (ulong)(uint)pNtk->vCos->nSize;
    }
  }
  return ppcVar1;
}

Assistant:

char ** Abc_NtkCollectCioNames( Abc_Ntk_t * pNtk, int fCollectCos )
{
    Abc_Obj_t * pObj;
    char ** ppNames;
    int i;
    if ( fCollectCos )
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    else
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    return ppNames;
}